

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_conserved_exp_entropy_ark.c
# Opt level: O2

int main(int argc,char **argv)

{
  sunrealtype sVar1;
  int iVar2;
  int iVar3;
  N_Vector y;
  double *ptr;
  N_Vector p_Var4;
  double *ptr_00;
  void *pvVar5;
  FILE *__s;
  void *ptr_01;
  void *user_data;
  void *user_data_00;
  code *pcVar6;
  char *pcVar7;
  code *pcVar8;
  bool bVar9;
  bool bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  SUNContext ctx;
  sunrealtype t;
  void *local_100;
  void *local_f8;
  long nst;
  void *local_e8;
  double local_e0;
  N_Vector local_d8;
  double local_d0;
  double local_c8;
  double *local_c0;
  long netf;
  long ncfn;
  long nni;
  long nje;
  long nsetups;
  long nrje;
  long nre;
  long nrbf;
  long nrf;
  long nfi;
  long nst_a;
  sunrealtype ent;
  sunrealtype ent0;
  long nfeLS;
  long nrnlsf;
  long nrnlsi;
  long nfe;
  
  ctx = (SUNContext)0x0;
  local_100 = (void *)0x0;
  if (argc < 2) {
    bVar10 = false;
    bVar9 = false;
  }
  else {
    iVar2 = atoi(argv[1]);
    bVar9 = iVar2 == 0;
    if (argc == 2) {
      bVar10 = false;
    }
    else {
      iVar2 = atoi(argv[2]);
      bVar10 = iVar2 == 0;
      if (3 < (uint)argc) {
        dVar13 = atof(argv[3]);
        uVar11 = SUB84(dVar13,0);
        uVar12 = (undefined4)((ulong)dVar13 >> 0x20);
        goto LAB_00102469;
      }
    }
  }
  uVar11 = 0;
  uVar12 = 0;
LAB_00102469:
  puts("\nConserved Exponential Entropy problem:");
  pcVar7 = "   method     = DIRK";
  if (bVar10) {
    pcVar7 = "   method     = ERK";
  }
  puts(pcVar7);
  printf("   reltol     = %.1e\n",0xa0b5ed8d);
  printf("   abstol     = %.1e\n",0xd9d7bdbb);
  if (0.0 < (double)CONCAT44(uVar12,uVar11)) {
    printf("   fixed h    = %.1e\n",uVar11);
  }
  pcVar7 = "   relaxation = ON";
  if (bVar9) {
    pcVar7 = "   relaxation = OFF";
  }
  puts(pcVar7);
  putchar(10);
  iVar2 = SUNContext_Create(0,&ctx);
  iVar3 = check_flag(iVar2,"SUNContext_Create");
  iVar2 = 1;
  if (iVar3 == 0) {
    y = (N_Vector)N_VNew_Serial(2,ctx);
    iVar3 = check_ptr(y,"N_VNew_Serial");
    if (iVar3 == 0) {
      ptr = (double *)N_VGetArrayPointer(y);
      iVar3 = check_ptr(ptr,"N_VGetArrayPointer");
      if (iVar3 == 0) {
        *(undefined4 *)ptr = 0;
        *(undefined4 *)((long)ptr + 4) = 0x3ff00000;
        *(undefined4 *)(ptr + 1) = 0;
        *(undefined4 *)((long)ptr + 0xc) = 0x3fe00000;
        p_Var4 = (N_Vector)N_VClone(y);
        iVar3 = check_ptr(p_Var4,"N_VClone");
        if (iVar3 == 0) {
          ptr_00 = (double *)N_VGetArrayPointer(p_Var4);
          iVar3 = check_ptr(ptr_00,"N_VGetArrayPointer");
          if (iVar3 == 0) {
            if (bVar10) {
              pcVar8 = f;
              pcVar6 = (code *)0x0;
            }
            else {
              pcVar6 = f;
              pcVar8 = (code *)0x0;
            }
            local_d8 = p_Var4;
            local_c0 = ptr_00;
            pvVar5 = (void *)ARKStepCreate(0,pcVar8,pcVar6,y,ctx);
            local_100 = pvVar5;
            iVar3 = check_ptr(pvVar5,"ARKStepCreate");
            if (iVar3 == 0) {
              iVar3 = ARKodeSStolerances(0xa0b5ed8d,pvVar5);
              iVar3 = check_flag(iVar3,"ARKodeSStolerances");
              if (iVar3 == 0) {
                if (!bVar9) {
                  iVar2 = ARKodeSetRelaxFn(pvVar5,Ent,JacEnt);
                  iVar2 = check_flag(iVar2,"ARKodeSetRelaxFn");
                  if (iVar2 != 0) {
                    return 1;
                  }
                }
                if (bVar10) {
                  local_f8 = (void *)0x0;
                  local_e8 = (void *)0x0;
                }
                else {
                  ptr_01 = (void *)SUNDenseMatrix(2,2,ctx);
                  iVar2 = check_ptr(ptr_01,"SUNDenseMatrix");
                  if (iVar2 != 0) {
                    return 1;
                  }
                  local_f8 = (void *)SUNLinSol_Dense(y,ptr_01,ctx);
                  iVar2 = check_ptr(local_f8,"SUNLinSol_Dense");
                  if (iVar2 != 0) {
                    return 1;
                  }
                  local_e8 = ptr_01;
                  iVar2 = ARKodeSetLinearSolver(pvVar5,local_f8,ptr_01);
                  iVar2 = check_flag(iVar2,"ARKodeSetLinearSolver");
                  if (iVar2 != 0) {
                    return 1;
                  }
                  iVar2 = ARKodeSetJacFn(pvVar5,Jac);
                  iVar2 = check_flag(iVar2,"ARKodeSetJacFn");
                  if (iVar2 != 0) {
                    return 1;
                  }
                  iVar2 = ARKStepSetTableName(pvVar5,"ARKODE_ARK2_DIRK_3_1_2","ARKODE_ERK_NONE");
                  iVar2 = check_flag(iVar2,"ARKStepSetTableName");
                  if (iVar2 != 0) {
                    return 1;
                  }
                  iVar2 = ARKodeSetNonlinConvCoef(0x47ae147b,pvVar5);
                  iVar2 = check_flag(iVar2,"ARKodeSetNonlinConvCoef");
                  if (iVar2 != 0) {
                    return 1;
                  }
                }
                if (0.0 < (double)CONCAT44(uVar12,uVar11)) {
                  iVar2 = ARKodeSetFixedStep(pvVar5);
                  iVar2 = check_flag(iVar2,"ARKodeSetFixedStep");
                  if (iVar2 != 0) {
                    return 1;
                  }
                }
                __s = fopen("ark_conserved_exp_entropy_ark.txt","w");
                fwrite("# vars: t u v entropy u_err v_err entropy_error\n",0x30,1,__s);
                t = 0.0;
                Ent(y,&ent0,user_data);
                local_e0 = ent0;
                fprintf(__s,"%23.16e %23.16e %23.16e %23.16e %23.16e %23.16e %23.16e\n",0,*ptr,
                        ptr[1],ent0,0,0,0);
                puts(" step   t              u              v              e              delta e");
                puts(
                    " -------------------------------------------------------------------------------"
                    );
                printf("%5d %14.6e %14.6e %14.6e %14.6e %14.6e\n",0,*ptr,ptr[1],local_e0,0,0);
                dVar13 = 0.0;
                while (dVar13 < 5.0) {
                  iVar2 = ARKodeEvolve(pvVar5,y,&t,2);
                  iVar2 = check_flag(iVar2,"ARKodeEvolve");
                  pvVar5 = local_100;
                  if (iVar2 != 0) break;
                  Ent(y,&ent,user_data_00);
                  ans(t,local_d8);
                  sVar1 = ent;
                  pvVar5 = local_100;
                  dVar13 = ent - local_e0;
                  local_c8 = *ptr - *local_c0;
                  local_d0 = ptr[1] - local_c0[1];
                  iVar2 = ARKodeGetNumSteps(local_100,&nst);
                  check_flag(iVar2,"ARKodeGetNumSteps");
                  if (nst % 0x28 == 0) {
                    printf("%5ld %14.6e %14.6e %14.6e %14.6e %14.6e\n",SUB84(t,0),*ptr,ptr[1],sVar1,
                           dVar13);
                  }
                  fprintf(__s,"%23.16e %23.16e %23.16e %23.16e %23.16e %23.16e %23.16e\n",SUB84(t,0)
                          ,*ptr,ptr[1],sVar1,local_c8,local_d0,dVar13);
                  dVar13 = t;
                }
                puts(
                    " -------------------------------------------------------------------------------"
                    );
                fclose(__s);
                iVar2 = ARKodeGetNumSteps(pvVar5,&nst);
                check_flag(iVar2,"ARKodeGetNumSteps");
                pvVar5 = local_100;
                iVar2 = ARKodeGetNumStepAttempts(local_100,&nst_a);
                check_flag(iVar2,"ARKodeGetNumStepAttempts");
                iVar2 = ARKodeGetNumErrTestFails(pvVar5,&netf);
                check_flag(iVar2,"ARKodeGetNumErrTestFails");
                iVar2 = ARKStepGetNumRhsEvals(pvVar5,&nfe,&nfi);
                check_flag(iVar2,"ARKStepGetNumRhsEvals");
                puts("\nFinal Solver Statistics:");
                printf("   Internal solver steps = %li (attempted = %li)\n",nst,nst_a);
                printf("   Total number of error test failures = %li\n",netf);
                printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",nfe,nfi);
                p_Var4 = local_d8;
                if (!bVar10) {
                  iVar2 = ARKodeGetNumNonlinSolvIters(pvVar5,&nni);
                  check_flag(iVar2,"ARKodeGetNumNonlinSolvIters");
                  iVar2 = ARKodeGetNumNonlinSolvConvFails(pvVar5,&ncfn);
                  check_flag(iVar2,"ARKodeGetNumNonlinSolvConvFails");
                  iVar2 = ARKodeGetNumLinSolvSetups(pvVar5,&nsetups);
                  check_flag(iVar2,"ARKodeGetNumLinSolvSetups");
                  iVar2 = ARKodeGetNumJacEvals(pvVar5,&nje);
                  check_flag(iVar2,"ARKodeGetNumJacEvals");
                  iVar2 = ARKodeGetNumLinRhsEvals(pvVar5,&nfeLS);
                  check_flag(iVar2,"ARKodeGetNumLinRhsEvals");
                  printf("   Total number of Newton iterations = %li\n",nni);
                  printf("   Total number of linear solver convergence failures = %li\n",ncfn);
                  printf("   Total linear solver setups = %li\n",nsetups);
                  printf("   Total number of Jacobian evaluations = %li\n",nje);
                  printf("   Total RHS evals for setting up the linear system = %li\n",nfeLS);
                }
                if (!bVar9) {
                  iVar2 = ARKodeGetNumRelaxFnEvals(pvVar5,&nre);
                  check_flag(iVar2,"ARKodeGetNumRelaxFnEvals");
                  iVar2 = ARKodeGetNumRelaxJacEvals(pvVar5,&nrje);
                  check_flag(iVar2,"ARKodeGetNumRelaxJacEvals");
                  iVar2 = ARKodeGetNumRelaxFails(pvVar5,&nrf);
                  check_flag(iVar2,"ARKodeGetNumRelaxFails");
                  iVar2 = ARKodeGetNumRelaxBoundFails(pvVar5,&nrbf);
                  check_flag(iVar2,"ARKodeGetNumRelaxBoundFails");
                  iVar2 = ARKodeGetNumRelaxSolveFails(pvVar5,&nrnlsf);
                  check_flag(iVar2,"ARKodeGetNumRelaxSolveFails");
                  iVar2 = ARKodeGetNumRelaxSolveIters(pvVar5,&nrnlsi);
                  check_flag(iVar2,"ARKodeGetNumRelaxSolveIters");
                  printf("   Total Relaxation Fn evals    = %li\n",nre);
                  printf("   Total Relaxation Jac evals   = %li\n",nrje);
                  printf("   Total Relaxation fails       = %li\n",nrf);
                  printf("   Total Relaxation bound fails = %li\n",nrbf);
                  printf("   Total Relaxation NLS fails   = %li\n",nrnlsf);
                  printf("   Total Relaxation NLS iters   = %li\n",nrnlsi);
                }
                putchar(10);
                ARKodeFree(&local_100);
                SUNLinSolFree(local_f8);
                SUNMatDestroy(local_e8);
                N_VDestroy(y);
                N_VDestroy(p_Var4);
                SUNContext_Free(&ctx);
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int main(int argc, char* argv[])
{
  /* Error-checking flag */
  int flag;

  /* Initial and final times */
  sunrealtype t0 = SUN_RCONST(0.0);
  sunrealtype tf = SUN_RCONST(5.0);

  /* Relative and absolute tolerances */
  sunrealtype reltol = SUN_RCONST(1.0e-6);
  sunrealtype abstol = SUN_RCONST(1.0e-10);

  /* SUNDIALS context, vector, matrix, and linear solver objects */
  SUNContext ctx     = NULL;
  N_Vector y         = NULL;
  N_Vector ytrue     = NULL;
  SUNMatrix A        = NULL;
  SUNLinearSolver LS = NULL;

  /* Pointer to vector data array */
  sunrealtype* ydata;
  sunrealtype* ytdata;

  /* Initial, current, and change in entropy value */
  sunrealtype ent0, ent, ent_err;

  /* Solution errors */
  sunrealtype u_err, v_err;

  /* ARKODE memory structure */
  void* arkode_mem = NULL;

  /* ARKODE statistics */
  long int nst, nst_a, nfe, nfi;
  long int nrf, nrbf, nre, nrje, nrnlsi, nrnlsf;
  long int nsetups, nje, nfeLS, nni, ncfn, netf;

  /* Output time and file */
  sunrealtype t;
  FILE* UFID;

  /* Command line options */
  int relax           = 1;               /* enable relaxation */
  int implicit        = 1;               /* implicit          */
  sunrealtype fixed_h = SUN_RCONST(0.0); /* adaptive stepping */

  /* -------------------- *
   * Output Problem Setup *
   * -------------------- */

  if (argc > 1) { relax = atoi(argv[1]); }
  if (argc > 2) { implicit = atoi(argv[2]); }
  if (argc > 3) { fixed_h = atof(argv[3]); }

  printf("\nConserved Exponential Entropy problem:\n");
  if (implicit) { printf("   method     = DIRK\n"); }
  else { printf("   method     = ERK\n"); }
  printf("   reltol     = %.1" ESYM "\n", reltol);
  printf("   abstol     = %.1" ESYM "\n", abstol);
  if (fixed_h > SUN_RCONST(0.0))
  {
    printf("   fixed h    = %.1" ESYM "\n", fixed_h);
  }
  if (relax) { printf("   relaxation = ON\n"); }
  else { printf("   relaxation = OFF\n"); }
  printf("\n");

  /* ------------ *
   * Setup ARKODE *
   * ------------ */

  /* Create the SUNDIALS context object for this simulation */
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(flag, "SUNContext_Create")) { return 1; }

  /* Create serial vector and set the initial condition values */
  y = N_VNew_Serial(2, ctx);
  if (check_ptr(y, "N_VNew_Serial")) { return 1; }

  ydata = N_VGetArrayPointer(y);
  if (check_ptr(ydata, "N_VGetArrayPointer")) { return 1; }

  ydata[0] = SUN_RCONST(1.0);
  ydata[1] = SUN_RCONST(0.5);

  ytrue = N_VClone(y);
  if (check_ptr(ytrue, "N_VClone")) { return 1; }

  ytdata = N_VGetArrayPointer(ytrue);
  if (check_ptr(ytdata, "N_VGetArrayPointer")) { return 1; }

  /* Initialize ARKStep */
  if (implicit) { arkode_mem = ARKStepCreate(NULL, f, t0, y, ctx); }
  else { arkode_mem = ARKStepCreate(f, NULL, t0, y, ctx); }
  if (check_ptr(arkode_mem, "ARKStepCreate")) { return 1; }

  /* Specify tolerances */
  flag = ARKodeSStolerances(arkode_mem, reltol, abstol);
  if (check_flag(flag, "ARKodeSStolerances")) { return 1; }

  if (relax)
  {
    /* Enable relaxation methods */
    flag = ARKodeSetRelaxFn(arkode_mem, Ent, JacEnt);
    if (check_flag(flag, "ARKodeSetRelaxFn")) { return 1; }
  }

  if (implicit)
  {
    /* Create dense matrix and linear solver */
    A = SUNDenseMatrix(2, 2, ctx);
    if (check_ptr(A, "SUNDenseMatrix")) { return 1; }

    LS = SUNLinSol_Dense(y, A, ctx);
    if (check_ptr(LS, "SUNLinSol_Dense")) { return 1; }

    /* Attach the matrix and linear solver */
    flag = ARKodeSetLinearSolver(arkode_mem, LS, A);
    if (check_flag(flag, "ARKodeSetLinearSolver")) { return 1; }

    /* Set Jacobian routine */
    flag = ARKodeSetJacFn(arkode_mem, Jac);
    if (check_flag(flag, "ARKodeSetJacFn")) { return 1; }

    /* Select a Butcher table with non-negative b values */
    flag = ARKStepSetTableName(arkode_mem, "ARKODE_ARK2_DIRK_3_1_2",
                               "ARKODE_ERK_NONE");
    if (check_flag(flag, "ARKStepSetTableName")) { return 1; }

    /* Tighten nonlinear solver tolerance */
    flag = ARKodeSetNonlinConvCoef(arkode_mem, SUN_RCONST(0.01));
    if (check_flag(flag, "ARKodeSetNonlinConvCoef")) { return 1; }
  }

  if (fixed_h > SUN_RCONST(0.0))
  {
    flag = ARKodeSetFixedStep(arkode_mem, fixed_h);
    if (check_flag(flag, "ARKodeSetFixedStep")) { return 1; }
  }

  /* Open output stream for results, output comment line */
  UFID = fopen("ark_conserved_exp_entropy_ark.txt", "w");
  fprintf(UFID, "# vars: t u v entropy u_err v_err entropy_error\n");

  /* --------------- *
   * Advance in Time *
   * --------------- */

  /* Initial time */
  t = t0;

  /* Output the initial condition and entropy */
  flag = Ent(y, &ent0, NULL);
  if (check_flag(flag, "Ent")) { return 1; }

  fprintf(UFID,
          "%23.16" ESYM " %23.16" ESYM " %23.16" ESYM " %23.16" ESYM
          " %23.16" ESYM " %23.16" ESYM " %23.16" ESYM "\n",
          t0, ydata[0], ydata[1], ent0, SUN_RCONST(0.0), SUN_RCONST(0.0),
          SUN_RCONST(0.0));

  printf(" step   t              u              v              e            "
         "  delta e\n");
  printf(" --------------------------------------------------------------------"
         "-----------\n");
  printf("%5d %14.6" ESYM " %14.6" ESYM " %14.6" ESYM " %14.6" ESYM
         " %14.6" ESYM "\n",
         0, t, ydata[0], ydata[1], ent0, SUN_RCONST(0.0));

  while (t < tf)
  {
    /* Evolve in time */
    flag = ARKodeEvolve(arkode_mem, tf, y, &t, ARK_ONE_STEP);
    if (check_flag(flag, "ARKodeEvolve")) { break; }

    /* Output solution and errors */
    flag = Ent(y, &ent, NULL);
    if (check_flag(flag, "Ent")) { return 1; }

    flag = ans(t, ytrue);
    if (check_flag(flag, "ans")) { return 1; }

    ent_err = ent - ent0;
    u_err   = ydata[0] - ytdata[0];
    v_err   = ydata[1] - ytdata[1];

    /* Output to the screen periodically */
    flag = ARKodeGetNumSteps(arkode_mem, &nst);
    check_flag(flag, "ARKodeGetNumSteps");

    if (nst % 40 == 0)
    {
      printf("%5ld %14.6" ESYM " %14.6" ESYM " %14.6" ESYM " %14.6" ESYM
             " %14.6" ESYM "\n",
             nst, t, ydata[0], ydata[1], ent, ent_err);
    }

    /* Write all steps to file */
    fprintf(UFID,
            "%23.16" ESYM " %23.16" ESYM " %23.16" ESYM " %23.16" ESYM
            " %23.16" ESYM " %23.16" ESYM " %23.16" ESYM "\n",
            t, ydata[0], ydata[1], ent, u_err, v_err, ent_err);
  }

  printf(" --------------------------------------------------------------------"
         "-----------\n");
  fclose(UFID);

  /* ------------ *
   * Output Stats *
   * ------------ */

  /* Get final statistics on how the solve progressed */
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(flag, "ARKodeGetNumSteps");

  flag = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_flag(flag, "ARKodeGetNumStepAttempts");

  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(flag, "ARKodeGetNumErrTestFails");

  flag = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
  check_flag(flag, "ARKStepGetNumRhsEvals");

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total number of error test failures = %li\n", netf);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);

  if (implicit)
  {
    flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
    check_flag(flag, "ARKodeGetNumNonlinSolvIters");

    flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &ncfn);
    check_flag(flag, "ARKodeGetNumNonlinSolvConvFails");

    flag = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
    check_flag(flag, "ARKodeGetNumLinSolvSetups");

    flag = ARKodeGetNumJacEvals(arkode_mem, &nje);
    check_flag(flag, "ARKodeGetNumJacEvals");

    flag = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
    check_flag(flag, "ARKodeGetNumLinRhsEvals");

    printf("   Total number of Newton iterations = %li\n", nni);
    printf("   Total number of linear solver convergence failures = %li\n", ncfn);
    printf("   Total linear solver setups = %li\n", nsetups);
    printf("   Total number of Jacobian evaluations = %li\n", nje);
    printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  }

  if (relax)
  {
    flag = ARKodeGetNumRelaxFnEvals(arkode_mem, &nre);
    check_flag(flag, "ARKodeGetNumRelaxFnEvals");

    flag = ARKodeGetNumRelaxJacEvals(arkode_mem, &nrje);
    check_flag(flag, "ARKodeGetNumRelaxJacEvals");

    flag = ARKodeGetNumRelaxFails(arkode_mem, &nrf);
    check_flag(flag, "ARKodeGetNumRelaxFails");

    flag = ARKodeGetNumRelaxBoundFails(arkode_mem, &nrbf);
    check_flag(flag, "ARKodeGetNumRelaxBoundFails");

    flag = ARKodeGetNumRelaxSolveFails(arkode_mem, &nrnlsf);
    check_flag(flag, "ARKodeGetNumRelaxSolveFails");

    flag = ARKodeGetNumRelaxSolveIters(arkode_mem, &nrnlsi);
    check_flag(flag, "ARKodeGetNumRelaxSolveIters");

    printf("   Total Relaxation Fn evals    = %li\n", nre);
    printf("   Total Relaxation Jac evals   = %li\n", nrje);
    printf("   Total Relaxation fails       = %li\n", nrf);
    printf("   Total Relaxation bound fails = %li\n", nrbf);
    printf("   Total Relaxation NLS fails   = %li\n", nrnlsf);
    printf("   Total Relaxation NLS iters   = %li\n", nrnlsi);
  }
  printf("\n");

  /* -------- *
   * Clean up *
   * -------- */

  /* Free ARKode integrator and SUNDIALS objects */
  ARKodeFree(&arkode_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  N_VDestroy(y);
  N_VDestroy(ytrue);
  SUNContext_Free(&ctx);

  return flag;
}